

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O1

PipelineExecuteResult __thiscall
duckdb::PipelineExecutor::Execute(PipelineExecutor *this,idx_t max_chunks)

{
  SourceResultType SVar1;
  bool bVar2;
  PipelineExecuteResult PVar3;
  reference this_00;
  type input;
  InterruptException *this_01;
  InternalException *this_02;
  OperatorResultType unaff_BPL;
  OperatorResultType OVar4;
  uint uVar5;
  ExecutionBudget chunk_budget;
  ExecutionBudget local_68;
  DataChunk *local_58;
  string local_50;
  
  if ((this->pipeline->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pipeline->operators).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    input = &this->final_chunk;
  }
  else {
    this_00 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
              ::operator[](&this->intermediate_chunks,0);
    input = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                      (this_00);
  }
  local_68.processed = 0;
  local_68.maximum_to_process = max_chunks;
  if (((((this->context).client)->interrupted)._M_base._M_i & 1U) == 0) {
    local_58 = &this->final_chunk;
    do {
      uVar5 = (uint)max_chunks;
      bVar2 = this->exhausted_source;
      if ((((bVar2 == true) && (this->done_flushing == true)) &&
          (this->remaining_sink_chunk == false)) &&
         ((this->next_batch_blocked == false &&
          ((this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur ==
           (this->in_process_operators).c.
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur)))) {
LAB_0103acb1:
        OVar4 = FINISHED;
      }
      else {
        if (this->remaining_sink_chunk == true) {
          unaff_BPL = ExecutePushInternal(this,local_58,&local_68,0);
          this->remaining_sink_chunk = false;
        }
        else if (((this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  (this->in_process_operators).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) || (this->started_flushing != false)) {
          if (bVar2 != false) {
            if ((this->next_batch_blocked == false) && (this->done_flushing == false)) {
              bVar2 = TryFlushCachingOperators(this,&local_68);
              if (bVar2) {
                this->done_flushing = true;
                goto LAB_0103acb1;
              }
              max_chunks = (idx_t)(this->remaining_sink_chunk + 1);
              OVar4 = HAVE_MORE_OUTPUT;
              goto LAB_0103acf3;
            }
            if ((bVar2 != false) && (this->next_batch_blocked != true)) {
              this_02 = (InternalException *)__cxa_allocate_exception(0x10);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,"Unexpected state reached in pipeline executor","");
              InternalException::InternalException(this_02,&local_50);
              __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
          }
          if (this->next_batch_blocked == false) {
            DataChunk::Reset(input);
            SVar1 = FetchFromSource(this,input);
            if (SVar1 != BLOCKED) {
              if (SVar1 == FINISHED) {
                this->exhausted_source = true;
              }
              goto LAB_0103ac0f;
            }
            OVar4 = HAVE_MORE_OUTPUT;
            uVar5 = (uint)SVar1;
LAB_0103acbf:
            bVar2 = false;
          }
          else {
LAB_0103ac0f:
            if (((this->required_partition_info).partition_columns.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 (this->required_partition_info).partition_columns.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish) &&
               (((this->required_partition_info).batch_index & 1U) == 0)) {
LAB_0103ac53:
              if ((this->exhausted_source == true) && (input->count == 0)) {
                OVar4 = BLOCKED;
                goto LAB_0103acbf;
              }
              OVar4 = NEED_MORE_INPUT;
              unaff_BPL = ExecutePushInternal(this,input,&local_68,0);
              bVar2 = true;
            }
            else {
              bVar2 = (bool)NextBatch(this,input);
              this->next_batch_blocked = bVar2;
              if (bVar2 == false) goto LAB_0103ac53;
              uVar5 = 2;
              bVar2 = false;
              OVar4 = HAVE_MORE_OUTPUT;
            }
          }
          max_chunks = (idx_t)uVar5;
          if (!bVar2) goto LAB_0103acf3;
        }
        else {
          unaff_BPL = ExecutePushInternal(this,input,&local_68,0);
        }
        OVar4 = unaff_BPL;
        if (unaff_BPL != FINISHED) {
          if (unaff_BPL == BLOCKED) {
            this->remaining_sink_chunk = true;
            max_chunks = 2;
            OVar4 = HAVE_MORE_OUTPUT;
            unaff_BPL = BLOCKED;
          }
          else {
            OVar4 = NEED_MORE_INPUT;
          }
        }
      }
LAB_0103acf3:
      if ((OVar4 != NEED_MORE_INPUT) && (OVar4 != BLOCKED)) {
        if (OVar4 != FINISHED) {
          return (PipelineExecuteResult)max_chunks;
        }
LAB_0103ad3d:
        if (this->exhausted_source == true) {
          if ((this->done_flushing == false) && (this->finished_processing_idx < 0)) {
            return NOT_FINISHED;
          }
        }
        else if (this->finished_processing_idx < 0) {
          return NOT_FINISHED;
        }
        PVar3 = PushFinalize(this);
        return PVar3;
      }
      if (local_68.maximum_to_process <= local_68.processed) goto LAB_0103ad3d;
      local_68.processed = local_68.processed + 1;
    } while (((((this->context).client)->interrupted)._M_base._M_i & 1U) == 0);
  }
  this_01 = (InterruptException *)__cxa_allocate_exception(0x10);
  InterruptException::InterruptException(this_01);
  __cxa_throw(this_01,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PipelineExecuteResult PipelineExecutor::Execute(idx_t max_chunks) {
	D_ASSERT(pipeline.sink);
	auto &source_chunk = pipeline.operators.empty() ? final_chunk : *intermediate_chunks[0];
	ExecutionBudget chunk_budget(max_chunks);
	do {
		if (context.client.interrupted) {
			throw InterruptException();
		}

		OperatorResultType result;
		if (exhausted_source && done_flushing && !remaining_sink_chunk && !next_batch_blocked &&
		    in_process_operators.empty()) {
			break;
		} else if (remaining_sink_chunk) {
			// The pipeline was interrupted by the Sink. We should retry sinking the final chunk.
			result = ExecutePushInternal(final_chunk, chunk_budget);
			D_ASSERT(result != OperatorResultType::HAVE_MORE_OUTPUT);
			remaining_sink_chunk = false;
		} else if (!in_process_operators.empty() && !started_flushing) {
			// Operator(s) in the pipeline have returned `HAVE_MORE_OUTPUT` in the last Execute call
			// the operators have to be called with the same input chunk to produce the rest of the output
			D_ASSERT(source_chunk.size() > 0);
			result = ExecutePushInternal(source_chunk, chunk_budget);
		} else if (exhausted_source && !next_batch_blocked && !done_flushing) {
			// The source was exhausted, try flushing all operators
			auto flush_completed = TryFlushCachingOperators(chunk_budget);
			if (flush_completed) {
				done_flushing = true;
				break;
			} else {
				if (remaining_sink_chunk) {
					return PipelineExecuteResult::INTERRUPTED;
				} else {
					D_ASSERT(chunk_budget.IsDepleted());
					return PipelineExecuteResult::NOT_FINISHED;
				}
			}
		} else if (!exhausted_source || next_batch_blocked) {
			SourceResultType source_result;
			if (!next_batch_blocked) {
				// "Regular" path: fetch a chunk from the source and push it through the pipeline
				source_chunk.Reset();
				source_result = FetchFromSource(source_chunk);
				if (source_result == SourceResultType::BLOCKED) {
					return PipelineExecuteResult::INTERRUPTED;
				}
				if (source_result == SourceResultType::FINISHED) {
					exhausted_source = true;
				}
			}

			if (required_partition_info.AnyRequired()) {
				auto next_batch_result = NextBatch(source_chunk);
				next_batch_blocked = next_batch_result == SinkNextBatchType::BLOCKED;
				if (next_batch_blocked) {
					return PipelineExecuteResult::INTERRUPTED;
				}
			}

			if (exhausted_source && source_chunk.size() == 0) {
				// To ensure that we're not early-terminating the pipeline
				continue;
			}

			result = ExecutePushInternal(source_chunk, chunk_budget);
		} else {
			throw InternalException("Unexpected state reached in pipeline executor");
		}

		// SINK INTERRUPT
		if (result == OperatorResultType::BLOCKED) {
			remaining_sink_chunk = true;
			return PipelineExecuteResult::INTERRUPTED;
		}

		if (result == OperatorResultType::FINISHED) {
			break;
		}
	} while (chunk_budget.Next());

	if ((!exhausted_source || !done_flushing) && !IsFinished()) {
		return PipelineExecuteResult::NOT_FINISHED;
	}

	return PushFinalize();
}